

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v8::detail::vformat_to<wchar_t>
               (buffer<wchar_t> *buf,basic_string_view<wchar_t> fmt,
               basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>
               args,locale_ref loc)

{
  wchar_t *pend;
  wchar_t wVar1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out;
  undefined1 value [16];
  undefined1 value_00 [16];
  wchar_t *pbegin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>_2
  aVar2;
  float value_01;
  type tVar3;
  wchar_t *end;
  wchar_t *pwVar4;
  writer write;
  undefined8 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff92;
  undefined1 local_68 [32];
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_48;
  wchar_t *local_40;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>_2
  local_38;
  locale_ref local_30;
  writer local_28;
  
  local_68._16_8_ = args.field_1;
  local_68._8_8_ = args.desc_;
  aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>_2
           )fmt.size_;
  pbegin = fmt.data_;
  if (((aVar2.values_ ==
        (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>
         *)0x2) && (*pbegin == L'{')) && (pbegin[1] == L'}')) {
    if ((long)local_68._8_8_ < 0) {
      if (((int)(type)args.desc_ < 1) ||
         (tVar3 = ((format_arg *)local_68._16_8_)->type_, tVar3 == none_type)) goto LAB_001a3bdb;
    }
    else {
      tVar3 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_001a3bdb:
        ::fmt::v8::detail::throw_format_error("argument not found");
      }
    }
    out.container =
         *(buffer<wchar_t> **)
          &((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>
             *)local_68._16_8_)->field_0;
    value_01 = SUB84(out.container,0);
    local_68._0_8_ = buf;
    local_68._24_8_ = loc.locale_;
    switch(tVar3) {
    case int_type:
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_int,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,(int)value_01);
      break;
    case uint_type:
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_unsigned_int,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,(uint)value_01);
      break;
    case long_long_type:
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_long_long,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,
                 (longlong)out.container);
      break;
    case ulong_long_type:
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_unsigned_long_long,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,
                 (unsigned_long_long)out.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff90;
      value._0_8_ = in_stack_ffffffffffffff88;
      value._10_6_ = in_stack_ffffffffffffff92;
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,___int128,_0>
                ((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff90;
      value_00._0_8_ = in_stack_ffffffffffffff88;
      value_00._10_6_ = in_stack_ffffffffffffff92;
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<wchar_t>::operator()
                ((default_arg_formatter<wchar_t> *)local_68,(bool)((byte)out.container & 1));
      break;
    case char_type:
      write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,(wchar_t)value_01);
      break;
    case float_type:
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_float,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,value_01);
      break;
    case double_type:
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_double,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,(double)out.container)
      ;
      break;
    case last_numeric_type:
      write<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_long_double,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,
                 (((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>
                    *)local_68._16_8_)->field_0).long_double_value);
      break;
    case cstring_type:
      write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf,
                 (wchar_t *)out.container);
      break;
    case string_type:
      copy_str_noinline<wchar_t,wchar_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                ((wchar_t *)out.container,
                 (wchar_t *)
                 ((long)&(out.container)->_vptr_buffer +
                 (((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>
                    *)local_68._16_8_)->field_0).string.size * 4),
                 (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)buf);
      break;
    case pointer_type:
      default_arg_formatter<wchar_t>::operator()
                ((default_arg_formatter<wchar_t> *)local_68,out.container);
      break;
    case custom_type:
      default_arg_formatter<wchar_t>::operator()
                ((default_arg_formatter<wchar_t> *)local_68,
                 (handle)(((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>
                            *)local_68._16_8_)->field_0).string);
      break;
    default:
      default_arg_formatter<wchar_t>::operator()((default_arg_formatter<wchar_t> *)local_68);
    }
  }
  else {
    local_68._24_8_ = local_68._24_8_ & 0xffffffff00000000;
    pend = pbegin + (long)aVar2;
    pwVar4 = pbegin;
    local_30.locale_ = loc.locale_;
    local_38 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>_2
                )local_68._16_8_;
    local_40 = (wchar_t *)local_68._8_8_;
    local_48.container = buf;
    local_68._8_8_ = pbegin;
    if ((long)aVar2.values_ < 0x20) {
      while (local_68._16_8_ = aVar2, end = pwVar4, end != pend) {
        pwVar4 = end + 1;
        if (*end == L'}') {
          if ((pwVar4 == pend) || (*pwVar4 != L'}')) {
            ::fmt::v8::detail::throw_format_error("unmatched \'}\' in format string");
          }
          vformat_to<wchar_t>::format_handler::on_text((format_handler *)local_68,pbegin,pwVar4);
          pbegin = end + 2;
          pwVar4 = pbegin;
          aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>_2
                   )local_68._16_8_;
        }
        else {
          aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>_2
                   )local_68._16_8_;
          if (*end == L'{') {
            vformat_to<wchar_t>::format_handler::on_text((format_handler *)local_68,pbegin,end);
            pbegin = parse_replacement_field<wchar_t,fmt::v8::detail::vformat_to<wchar_t>(fmt::v8::detail::buffer<wchar_t>&,fmt::v8::basic_string_view<wchar_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<wchar_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<wchar_t>::type>>>::type,fmt::v8::type_identity<wchar_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                               (end,pend,(format_handler *)local_68);
            pwVar4 = pbegin;
            aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>_2
                     )local_68._16_8_;
          }
        }
      }
      vformat_to<wchar_t>::format_handler::on_text((format_handler *)local_68,pbegin,pend);
    }
    else {
      local_28.handler_ = (format_handler *)local_68;
      while (local_68._16_8_ = aVar2, pbegin != pend) {
        wVar1 = *pbegin;
        pwVar4 = pbegin;
        while (wVar1 != L'{') {
          pwVar4 = pwVar4 + 1;
          if (pwVar4 == pend) {
            parse_format_string<false,_wchar_t,_format_handler>::writer::operator()
                      (&local_28,pbegin,pend);
            return;
          }
          wVar1 = *pwVar4;
        }
        parse_format_string<false,_wchar_t,_format_handler>::writer::operator()
                  (&local_28,pbegin,pwVar4);
        pbegin = parse_replacement_field<wchar_t,fmt::v8::detail::vformat_to<wchar_t>(fmt::v8::detail::buffer<wchar_t>&,fmt::v8::basic_string_view<wchar_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<wchar_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<wchar_t>::type>>>::type,fmt::v8::type_identity<wchar_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                           (pwVar4,pend,(format_handler *)local_68);
        aVar2 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>_>_2
                 )local_68._16_8_;
      }
    }
  }
  return;
}

Assistant:

void vformat_to(
    buffer<Char>& buf, basic_string_view<Char> fmt,
    basic_format_args<FMT_BUFFER_CONTEXT(type_identity_t<Char>)> args,
    locale_ref loc) {
  // workaround for msvc bug regarding name-lookup in module
  // link names into function scope
  using detail::arg_formatter;
  using detail::buffer_appender;
  using detail::custom_formatter;
  using detail::default_arg_formatter;
  using detail::get_arg;
  using detail::locale_ref;
  using detail::parse_format_specs;
  using detail::specs_checker;
  using detail::specs_handler;
  using detail::to_unsigned;
  using detail::type;
  using detail::write;
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> args, locale_ref loc)
        : parse_context(str), context(out, args, loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(parse_context.begin() +
                                 (begin - &*parse_context.begin()));
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = basic_format_specs<Char>();
      specs_checker<specs_handler<Char>> handler(
          specs_handler<Char>(specs, parse_context, context), arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}